

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

int __thiscall testing::internal::UnitTestImpl::test_case_to_run_count(UnitTestImpl *this)

{
  int iVar1;
  UnitTestImpl *this_local;
  
  iVar1 = CountIf<std::vector<testing::TestCase*,std::allocator<testing::TestCase*>>,bool(*)(testing::TestCase_const*)>
                    (&this->test_cases_,ShouldRunTestCase);
  return iVar1;
}

Assistant:

int UnitTestImpl::test_case_to_run_count() const {
  return CountIf(test_cases_, ShouldRunTestCase);
}